

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

uint Ga2_ObjComputeTruthSpecial(Gia_Man_t *p,Gia_Obj_t *pRoot,Vec_Int_t *vLeaves,Vec_Int_t *vLits)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint *puVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  int pUsed [5];
  uint local_58 [6];
  Vec_Int_t *local_40;
  Gia_Obj_t *local_38;
  
  if (((int)(uint)*(undefined8 *)pRoot < 0) ||
     (((uint)*(undefined8 *)pRoot & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                  ,0x208,
                  "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  iVar2 = vLeaves->nSize;
  puVar13 = Ga2_ManComputeTruth::uTruth5;
  if (0 < (long)iVar2) {
    piVar6 = vLeaves->pArray;
    lVar18 = 0;
    do {
      iVar3 = piVar6[lVar18];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_005fedfa;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (vLits->nSize <= lVar18) goto LAB_005feddb;
      uVar10 = vLits->pArray[lVar18];
      if ((int)uVar10 < 0) {
        __assert_fail("Entry >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x211,
                      "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (uVar10 != 0) {
        if (uVar10 == 1) {
          uVar10 = 0xffffffff;
        }
        else {
          uVar10 = *puVar13;
        }
      }
      p->pObjs[iVar3].Value = uVar10;
      lVar18 = lVar18 + 1;
      puVar13 = puVar13 + 1;
    } while (iVar2 != lVar18);
  }
  local_40 = vLeaves;
  uVar10 = Ga2_ObjComputeTruth_rec(p,pRoot,1);
  if (0xfffffffd < uVar10 - 1) {
LAB_005fed8b:
    iVar2 = local_40->nSize;
    if (0 < (long)iVar2) {
      piVar6 = local_40->pArray;
      lVar18 = 0;
      do {
        iVar3 = piVar6[lVar18];
        if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_005fedfa:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) {
          return uVar10;
        }
        p->pObjs[iVar3].Value = 0;
        lVar18 = lVar18 + 1;
      } while (iVar2 != lVar18);
    }
    return uVar10;
  }
  uVar4 = local_40->nSize;
  if (0 < (int)uVar4) {
    uVar11 = 0;
    puVar13 = &Ga2_ObjTruthDepends_uInvTruth5;
    uVar14 = 0;
    do {
      if (uVar11 == 5) goto LAB_005fee19;
      if ((*puVar13 & (uVar10 >> ((byte)(1 << ((byte)uVar11 & 0x1f)) & 0x1f) ^ uVar10)) != 0) {
        lVar18 = (long)(int)uVar14;
        uVar14 = uVar14 + 1;
        local_58[lVar18] = (uint)uVar11;
      }
      uVar11 = uVar11 + 1;
      puVar13 = puVar13 + 1;
    } while (uVar4 != uVar11);
    if (0 < (int)uVar14) {
      local_38 = pRoot;
      uVar11 = (ulong)uVar14;
      if (uVar14 != 1) {
        uVar12 = 1;
        uVar15 = 0;
        do {
          uVar1 = uVar15 + 1;
          uVar19 = uVar15 & 0xffffffff;
          uVar16 = uVar12;
          do {
            uVar10 = local_58[uVar16];
            if (((long)(int)uVar10 < 0) || (vLits->nSize <= (int)uVar10)) goto LAB_005feddb;
            uVar20 = local_58[(int)uVar19];
            if (((long)(int)uVar20 < 0) || ((uint)vLits->nSize <= uVar20)) goto LAB_005feddb;
            uVar9 = uVar16 & 0xffffffff;
            if (vLits->pArray[(int)uVar20] <= vLits->pArray[(int)uVar10]) {
              uVar9 = uVar19;
            }
            uVar19 = uVar9;
            uVar16 = uVar16 + 1;
          } while (uVar11 != uVar16);
          uVar10 = local_58[uVar15];
          local_58[uVar15] = local_58[(int)uVar19];
          local_58[(int)uVar19] = uVar10;
          uVar12 = uVar12 + 1;
          uVar15 = uVar1;
        } while (uVar1 != uVar14 - 1);
      }
      pVVar8 = local_40;
      if (-1 < (long)(int)local_58[0]) {
        uVar10 = vLits->nSize;
        if ((int)local_58[0] < (int)uVar10) {
          uVar20 = local_58[uVar14 - 1];
          if ((-1 < (long)(int)uVar20) && (uVar20 < uVar10)) {
            piVar6 = vLits->pArray;
            if (piVar6[(int)uVar20] < piVar6[(int)local_58[0]]) {
              __assert_fail("Vec_IntEntry(vLits, pUsed[0]) <= Vec_IntEntry(vLits, pUsed[nUsed-1])",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                            ,0x22f,
                            "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            if (0 < (int)uVar4) {
              piVar7 = local_40->pArray;
              uVar15 = 0;
              do {
                iVar2 = piVar7[uVar15];
                if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_005fedfa;
                if (p->pObjs == (Gia_Obj_t *)0x0) break;
                if (uVar10 == uVar15) goto LAB_005feddb;
                iVar3 = piVar6[uVar15];
                if (iVar3 < 0) {
                  __assert_fail("Entry >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                                ,0x234,
                                "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                               );
                }
                uVar20 = -(uint)(iVar3 == 1) | 0xdeadcafe;
                if (iVar3 == 0) {
                  uVar20 = 0;
                }
                p->pObjs[iVar2].Value = uVar20;
                uVar15 = uVar15 + 1;
              } while (uVar4 != uVar15);
            }
            lVar18 = 0;
            uVar15 = uVar11;
            do {
              uVar20 = *(uint *)((long)local_58 + lVar18);
              lVar17 = (long)(int)uVar20;
              if ((lVar17 < 0) || (uVar10 <= uVar20)) goto LAB_005feddb;
              uVar5 = piVar6[lVar17];
              if ((int)uVar5 < 2) {
                __assert_fail("Entry > 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                              ,0x23f,
                              "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              if ((int)uVar4 <= (int)uVar20) goto LAB_005feddb;
              iVar2 = pVVar8->pArray[lVar17];
              if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_005fedfa;
              p->pObjs[iVar2].Value =
                   -(uVar5 & 1) ^ *(uint *)((long)Ga2_ManComputeTruth::uTruth5 + lVar18);
              *(uint *)((long)local_58 + lVar18) = uVar5 & 0x7ffffffe;
              lVar18 = lVar18 + 4;
              uVar15 = uVar15 - 1;
            } while (uVar15 != 0);
            uVar10 = Ga2_ObjComputeTruth_rec(p,local_38,1);
            vLits->nSize = 0;
            puVar13 = &Ga2_ObjTruthDepends_uInvTruth5;
            uVar15 = 0;
            do {
              Vec_IntPush(vLits,local_58[uVar15]);
              if (uVar15 == 5) {
LAB_005fee19:
                __assert_fail("v >= 0 && v <= 4",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                              ,0x1fd,"unsigned int Ga2_ObjTruthDepends(unsigned int, int)");
              }
              if ((*puVar13 & (uVar10 >> ((byte)(1 << ((byte)uVar15 & 0x1f)) & 0x1f) ^ uVar10)) == 0
                 ) {
                __assert_fail("Ga2_ObjTruthDepends(Res, i)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                              ,0x24e,
                              "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              uVar15 = uVar15 + 1;
              puVar13 = puVar13 + 1;
            } while (uVar11 != uVar15);
            if ((int)uVar14 < 5) {
              puVar13 = &Ga2_ObjTruthDepends_uInvTruth5 + uVar11;
              do {
                if ((*puVar13 & (uVar10 >> ((byte)(1 << ((byte)uVar11 & 0x1f)) & 0x1f) ^ uVar10)) !=
                    0) {
                  __assert_fail("!Ga2_ObjTruthDepends(Res, i)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                                ,0x253,
                                "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                               );
                }
                uVar11 = uVar11 + 1;
                puVar13 = puVar13 + 1;
              } while ((int)uVar11 != 5);
            }
            goto LAB_005fed8b;
          }
        }
      }
LAB_005feddb:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  __assert_fail("nUsed > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                ,0x22c,
                "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

unsigned Ga2_ObjComputeTruthSpecial( Gia_Man_t * p, Gia_Obj_t * pRoot, Vec_Int_t * vLeaves, Vec_Int_t * vLits )
{
    int fVerbose = 0;
    static unsigned uTruth5[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned Res;
    Gia_Obj_t * pObj;
    int i, Entry;
//    int Id = Gia_ObjId(p, pRoot);
    assert( Gia_ObjIsAnd(pRoot) );

    if ( fVerbose )
    printf( "Object %d.\n", Gia_ObjId(p, pRoot) );

    // assign elementary truth tables
    Gia_ManForEachObjVec( vLeaves, p, pObj, i )
    {
        Entry = Vec_IntEntry( vLits, i );
        assert( Entry >= 0 );
        if ( Entry == 0 )
            pObj->Value = 0;
        else if ( Entry == 1 )
            pObj->Value = ~0;
        else // non-trivial literal
            pObj->Value = uTruth5[i];
        if ( fVerbose )
        printf( "%d ", Entry );
    }

    if ( fVerbose )
    {
    Res = Ga2_ObjTruth( p, pRoot );
//    Kit_DsdPrintFromTruth( &Res, Vec_IntSize(vLeaves) );
    printf( "\n" );
    }

    // compute truth table
    Res = Ga2_ObjComputeTruth_rec( p, pRoot, 1 );
    if ( Res != 0 && Res != ~0 )
    {
        // find essential variables
        int nUsed = 0, pUsed[5];
        for ( i = 0; i < Vec_IntSize(vLeaves); i++ )
            if ( Ga2_ObjTruthDepends( Res, i ) )
                pUsed[nUsed++] = i;
        assert( nUsed > 0 );
        // order positions by literal value
        Vec_IntSelectSortCost( pUsed, nUsed, vLits );
        assert( Vec_IntEntry(vLits, pUsed[0]) <= Vec_IntEntry(vLits, pUsed[nUsed-1]) );
        // assign elementary truth tables to the leaves
        Gia_ManForEachObjVec( vLeaves, p, pObj, i )
        {
            Entry = Vec_IntEntry( vLits, i );
            assert( Entry >= 0 );
            if ( Entry == 0 )
                pObj->Value = 0;
            else if ( Entry == 1 )
                pObj->Value = ~0;
            else // non-trivial literal
                pObj->Value = 0xDEADCAFE; // not important
        }
        for ( i = 0; i < nUsed; i++ )
        {
            Entry = Vec_IntEntry( vLits, pUsed[i] );
            assert( Entry > 1 );
            pObj = Gia_ManObj( p, Vec_IntEntry(vLeaves, pUsed[i]) );
            pObj->Value = Abc_LitIsCompl(Entry) ? ~uTruth5[i] : uTruth5[i];
//            pObj->Value = uTruth5[i];
            // remember this literal
            pUsed[i] = Abc_LitRegular(Entry);
//            pUsed[i] = Entry;
        }
        // compute truth table
        Res = Ga2_ObjComputeTruth_rec( p, pRoot, 1 );
        // reload the literals
        Vec_IntClear( vLits );
        for ( i = 0; i < nUsed; i++ )
        {
            Vec_IntPush( vLits, pUsed[i] );
            assert( Ga2_ObjTruthDepends(Res, i) );
            if ( fVerbose )
            printf( "%d ", pUsed[i] );
        }
        for ( ; i < 5; i++ )
            assert( !Ga2_ObjTruthDepends(Res, i) );

if ( fVerbose )
{
//    Kit_DsdPrintFromTruth( &Res, nUsed );
    printf( "\n" );
}

    }
    else
    {

if ( fVerbose )
{
    Vec_IntClear( vLits );
    printf( "Const %d\n", Res > 0 );
}

    }
    Gia_ManForEachObjVec( vLeaves, p, pObj, i )
        pObj->Value = 0;
    return Res;
}